

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O1

Class objc_upgrade_class(objc_class_gsv1 *oldClass)

{
  objc_ivar_list_gcc *poVar1;
  objc_ivar_list_gcc type;
  int *piVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Class aClass;
  objc_ivar_list *poVar7;
  objc_ivar_list_gcc *poVar8;
  ulong uVar9;
  objc_method_list *poVar10;
  objc_property_list *poVar11;
  Class poVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  objc_ivar_list_gcc *poVar21;
  bool bVar22;
  
  aClass = (Class)calloc(0x88,1);
  aClass->isa = oldClass->isa;
  aClass->name = oldClass->name;
  aClass->version = oldClass->version;
  aClass->info = 1;
  aClass->instance_size = oldClass->instance_size;
  poVar1 = oldClass->ivars;
  if (poVar1 == (objc_ivar_list_gcc *)0x0) {
    poVar7 = (objc_ivar_list *)0x0;
  }
  else {
    iVar20 = poVar1->count;
    poVar7 = (objc_ivar_list *)calloc(1,(long)iVar20 << 5 | 0x10);
    poVar7->size = 0x20;
    poVar7->count = iVar20;
    uVar9 = (ulong)(uint)poVar1->count;
    if (0 < poVar1->count) {
      poVar21 = poVar1 + 9;
      iVar20 = -2;
      uVar18 = 0;
      do {
        uVar19 = uVar18 + 1;
        iVar15 = (int)uVar9;
        uVar4 = (uint)uVar18;
        if ((long)uVar19 < (long)iVar15) {
          iVar13 = poVar1[uVar19 * 3 + 3].count;
          iVar16 = poVar1[uVar18 * 3 + 3].count;
          if (iVar16 == iVar13) {
            if ((int)(uVar4 + 2) < iVar15) {
              iVar15 = iVar15 + iVar20;
              poVar8 = poVar21;
              do {
                iVar17 = poVar8->count - iVar16;
                if (iVar17 != 0) goto LAB_00118252;
                poVar8 = poVar8 + 3;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
              iVar17 = 0;
            }
            else {
              iVar17 = 0;
            }
LAB_00118252:
            if (iVar17 == 0) {
              iVar17 = (int)oldClass->instance_size - iVar16;
            }
            bVar22 = false;
          }
          else {
            iVar17 = 0;
            bVar22 = true;
          }
        }
        else {
          iVar13 = (int)oldClass->instance_size;
          iVar17 = 0;
          bVar22 = true;
        }
        iVar15 = -iVar13;
        if (0 < iVar13) {
          iVar15 = iVar13;
        }
        type = poVar1[uVar18 * 3 + 2];
        iVar13 = poVar1[uVar18 * 3 + 3].count;
        iVar16 = iVar15 - iVar13;
        *(objc_ivar_list_gcc *)(poVar7 + uVar18 * 2 + 1) = poVar1[uVar18 * 3 + 1];
        if (bVar22) {
          iVar17 = iVar16;
        }
        poVar7[uVar18 * 2 + 1].size = (size_t)type;
        *(int *)&poVar7[uVar18 * 2 + 2].size = iVar17;
        if ((oldClass->info & 0x10) == 0) {
          poVar8 = poVar1 + uVar18 * 3 + 3;
        }
        else {
          poVar8 = (objc_ivar_list_gcc *)oldClass->ivar_offsets[uVar18];
        }
        *(objc_ivar_list_gcc **)(poVar7 + uVar18 * 2 + 2) = poVar8;
        uVar9 = 8;
        if ((type != (objc_ivar_list_gcc)0x0) && (*(char *)type != '\0')) {
          uVar9 = objc_alignof_type((char *)type);
        }
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar6 = (int)lVar3 << 3;
        if (uVar9 == 0) {
          uVar6 = 0;
        }
        uVar5 = *(uint *)((long)&poVar7[uVar18 * 2 + 2].size + 4) & 0xfffffe07;
        *(uint *)((long)&poVar7[uVar18 * 2 + 2].size + 4) = uVar5 | uVar6;
        if (*(char *)type == '\0') {
          lVar3 = 0x3f;
          if ((long)iVar16 != 0) {
            for (; (ulong)(long)iVar16 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar14 = (int)lVar3 << 3;
          if (iVar15 == iVar13) {
            uVar14 = 0;
          }
          *(uint *)((long)&poVar7[uVar18 * 2 + 2].size + 4) = uVar5 | uVar6 & 0xfffffe07 | uVar14;
        }
        uVar6 = 3;
        if (((oldClass->info & 0x10) != 0) && (1 < (int)oldClass->abi_version + 1)) {
          piVar2 = (int *)oldClass->strong_pointers;
          if (((ulong)piVar2 & 1) == 0) {
            if (uVar18 >> 5 < (ulong)(long)*piVar2) {
              bVar22 = ((uint)piVar2[(uVar18 >> 5) + 1] >> (uVar4 & 0x1f) & 1) != 0;
              goto LAB_001183c6;
            }
          }
          else {
            bVar22 = ((long)(2 << ((byte)uVar18 & 0x1f)) & ~(ulong)piVar2) == 0;
LAB_001183c6:
            uVar6 = 1;
            if (bVar22) goto LAB_0011841c;
          }
          piVar2 = (int *)oldClass->weak_pointers;
          if (((ulong)piVar2 & 1) == 0) {
            if (uVar18 >> 5 < (ulong)(long)*piVar2) {
              bVar22 = ((uint)piVar2[(uVar18 >> 5) + 1] >> (uVar4 & 0x1f) & 1) != 0;
            }
            else {
              bVar22 = false;
            }
          }
          else {
            bVar22 = ((long)(2 << ((byte)uVar18 & 0x1f)) & ~(ulong)piVar2) == 0;
          }
          uVar6 = bVar22 ^ 3;
        }
LAB_0011841c:
        *(uint *)((long)&poVar7[uVar18 * 2 + 2].size + 4) =
             *(uint *)((long)&poVar7[uVar18 * 2 + 2].size + 4) & 0xfffffffc | uVar6;
        uVar9 = (ulong)poVar1->count;
        iVar20 = iVar20 + -1;
        poVar21 = poVar21 + 3;
        uVar18 = uVar19;
      } while ((long)uVar19 < (long)uVar9);
    }
  }
  aClass->ivars = poVar7;
  poVar10 = upgradeMethodList(oldClass->methods);
  aClass->methods = poVar10;
  aClass->protocols = oldClass->protocols;
  aClass->abi_version = oldClass->abi_version;
  poVar11 = upgradePropertyList(oldClass->properties);
  aClass->properties = poVar11;
  objc_register_selectors_from_class(aClass);
  if ((oldClass->info & 2) == 0) {
    aClass->info = 0;
    poVar12 = objc_upgrade_class((objc_class_gsv1 *)aClass->isa);
    aClass->isa = poVar12;
    objc_setAssociatedObject((id_conflict)aClass,&legacy_key,(id_conflict)oldClass,0);
  }
  else {
    aClass->instance_size = 0x88;
  }
  return aClass;
}

Assistant:

PRIVATE Class objc_upgrade_class(struct objc_class_gsv1 *oldClass)
{
	Class cls = calloc(sizeof(struct objc_class), 1);
	cls->isa = oldClass->isa;
	// super_class is left nil and we upgrade it later.
	cls->name = oldClass->name;
	cls->version = oldClass->version;
	cls->info = objc_class_flag_meta;
	cls->instance_size = oldClass->instance_size;
	cls->ivars = upgradeIvarList(oldClass);
	cls->methods = upgradeMethodList(oldClass->methods);
	cls->protocols = oldClass->protocols;
	cls->abi_version = oldClass->abi_version;
	cls->properties = upgradePropertyList(oldClass->properties);
	objc_register_selectors_from_class(cls);
	if (!objc_test_class_flag_gsv1(oldClass, objc_class_flag_meta_gsv1))
	{
		cls->info = 0;
		cls->isa = objc_upgrade_class((struct objc_class_gsv1*)cls->isa);
		objc_setAssociatedObject((id)cls, &legacy_key, (id)oldClass, OBJC_ASSOCIATION_ASSIGN);
	}
	else
	{
		cls->instance_size = sizeof(struct objc_class);
	}
	return cls;
}